

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_class.h
# Opt level: O0

kNode * new_MethodNode(KonohaContext *kctx,kNameSpace *ns,KClass *reqc,kMethod *mtd,int n,...)

{
  code *pcVar1;
  char in_AL;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  kNode *pkVar5;
  KClass *in_RCX;
  kNameSpace *in_RDX;
  kNode *in_RSI;
  kMethod *in_RDI;
  kNodeVar *in_R9;
  KonohaContext *in_XMM0_Qa;
  KonohaContext *unaff_retaddr;
  va_list ap;
  kNode *expr;
  __va_list_tag *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  KonohaContext *in_stack_ffffffffffffff38;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff38 = in_XMM0_Qa;
  }
  lVar2 = (**(code **)(in_RDI->invokeKMethodFunc + 0x170))
                    (in_RDI,*(undefined8 *)(in_RDI->flag + 0x20),
                     *(undefined8 *)(**(long **)&in_RDI->typeId + 0x48),in_RSI);
  pcVar1 = (code *)(in_RDI->h).prototypePtr[0xc].refc;
  uVar4 = *(undefined8 *)(lVar2 + 0x30);
  uVar3 = (**(code **)(in_RDI->invokeKMethodFunc + 0x170))
                    (in_RDI,0,*(undefined8 *)(*(long *)((in_RDI->field_2).vcode_start + 8) + 0x30));
  (*pcVar1)(lVar2,uVar4,uVar3);
  uVar4 = (**(code **)(in_RDI->invokeKMethodFunc + 0x170))
                    (in_RDI,0,*(undefined8 *)(*(long *)((in_RDI->field_2).vcode_start + 8) + 0x30));
  *(undefined8 *)(lVar2 + 0x30) = uVar4;
  (**(code **)(in_RDI->invokeKMethodFunc + 0x1d8))(in_RDI,*(undefined8 *)(lVar2 + 0x30),in_RCX);
  pkVar5 = kNode_AddSeveral(in_stack_ffffffffffffff38,in_R9,in_stack_ffffffffffffff2c,
                            in_stack_ffffffffffffff20);
  pkVar5->nodeType = 9;
  pkVar5 = TypeCheckMethodParam(unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX);
  return pkVar5;
}

Assistant:

static kNode *new_MethodNode(KonohaContext *kctx, kNameSpace *ns, KClass *reqc, kMethod *mtd, int n, ...)
{
	kNode *expr = new_(Node, ns, OnGcStack);
	KFieldSet(expr, expr->NodeList, new_(Array, 0, OnField));
	KLIB kArray_Add(kctx, expr->NodeList, mtd);
	va_list ap;
	va_start(ap, n);
	expr = kNode_AddSeveral(kctx, expr, n, ap);
	va_end(ap);
	kNode_setnode(expr, KNode_MethodCall);
	return TypeCheckMethodParam(kctx, mtd, expr, ns, reqc);
}